

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

ssize_t __thiscall Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  undefined4 extraout_var;
  ssize_t sVar7;
  ulong uVar8;
  size_t __n_00;
  undefined7 uVar9;
  undefined4 in_register_00000034;
  Message *this_00;
  Serializer serializer;
  anon_union_4_2_1319dbad anon_var_0;
  undefined1 local_78 [36];
  int local_54;
  undefined1 local_50 [32];
  long lVar6;
  
  this_00 = (Message *)CONCAT44(in_register_00000034,__fd);
  peVar2 = (this->mSocketClient).super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((peVar2 == (element_type *)0x0) || (peVar2->mFd == -1)) {
    if (this->mWarned == false) {
      this->mWarned = true;
      uVar8 = 0;
      warning("Trying to send message to unconnected client (%d)",(ulong)this_00->mMessageId);
    }
    else {
      uVar8 = 0;
    }
  }
  else {
    std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
              ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)local_78,
               (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_50._0_8_ = this_00;
    Signal<std::function<void(std::shared_ptr<Connection>,Message_const*)>>::operator()
              (&this->mAboutToSend,(shared_ptr<Connection> *)local_78,(Message **)local_50);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    iVar5 = (*this_00->_vptr_Message[4])(this_00);
    lVar6 = CONCAT44(extraout_var,iVar5);
    uVar9 = (undefined7)((ulong)this_00 >> 8);
    if ((lVar6 == -1) || ((this_00->mFlags & 2) != 0)) {
      local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78[0x10] = '\0';
      local_50._8_8_ = (void *)0x0;
      local_50[0x10] = '\0';
      local_78._0_8_ = (element_type *)(local_78 + 0x10);
      local_50._0_8_ = (Message *)(local_50 + 0x10);
      Message::prepare(this_00,this->mVersion,(String *)local_78,(String *)local_50);
      __n_00 = (long)(_func_int ***)local_78._8_8_ + local_50._8_8_;
      this->mPendingWrite = this->mPendingWrite + (int)__n_00;
      if ((lVar6 != -1) && (lVar6 != local_78._8_8_ + local_50._8_8_ + -4)) {
        __assert_fail("size == String::npos || size == (header.size() + value.size() - 4)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0xde,"bool Connection::send(const Message &)");
      }
      sVar7 = SocketClient::write((this->mSocketClient).
                                  super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(int)local_78._0_8_,(void *)local_78._8_8_,__n_00);
      if ((char)sVar7 == '\0') {
        uVar8 = 0;
      }
      else if ((void *)local_50._8_8_ == (void *)0x0) {
        uVar8 = CONCAT71(uVar9,1);
      }
      else {
        uVar8 = SocketClient::write((this->mSocketClient).
                                    super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,(int)local_50._0_8_,(void *)local_50._8_8_,__n_00);
        uVar8 = uVar8 & 0xffffffff;
      }
      if ((Message *)local_50._0_8_ != (Message *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
      if ((element_type *)local_78._0_8_ != (element_type *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
      }
    }
    else {
      this->mPendingWrite = this->mPendingWrite + iVar5 + 10;
      local_78._8_8_ = operator_new(0x20);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR__SocketClientBuffer_00190fd0;
      *(element_type **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
           (this->mSocketClient).super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      p_Var3 = (this->mSocketClient).super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)p_Var3;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._8_8_ + 0x10))->_M_use_count = 0;
      local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
      iVar1 = this->mVersion;
      local_54 = iVar5 + 6;
      iVar5 = (*((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->
                _vptr__Sp_counted_base[2])(local_78._8_8_,&local_54,4);
      if ((char)iVar5 == '\0') {
        local_78[0] = (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>)0x1;
      }
      local_50._0_4_ = iVar1;
      if ((local_78[0] == (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>)0x0) &&
         (iVar5 = (*(*(_func_int ***)local_78._8_8_)[2])(local_78._8_8_,local_50,4),
         (char)iVar5 == '\0')) {
        local_78[0] = (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>)0x1;
      }
      if ((local_78[0] == (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>)0x0) &&
         (local_50[0] = this_00->mMessageId,
         iVar5 = (*(*(_func_int ***)local_78._8_8_)[2])(local_78._8_8_,local_50,1),
         (char)iVar5 == '\0')) {
        local_78[0] = (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>)0x1;
      }
      local_50[0] = this_00->mFlags;
      if ((local_78[0] == (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>)0x0) &&
         (iVar5 = (*(*(_func_int ***)local_78._8_8_)[2])(local_78._8_8_,local_50,1),
         (char)iVar5 == '\0')) {
        local_78[0] = (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>)0x1;
      }
      (*this_00->_vptr_Message[2])(this_00,local_78);
      _Var4 = local_78[0];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_78._8_8_)[1])();
      }
      uVar8 = CONCAT71(uVar9,_Var4) ^ 1;
    }
  }
  return uVar8 & 0xffffffff;
}

Assistant:

bool Connection::send(const Message &message)
{
    // ::error() << getpid() << "sending message" << static_cast<int>(message.messageId());
    if (!mSocketClient || !mSocketClient->isConnected()) {
        if (!mWarned) {
            mWarned = true;
            warning("Trying to send message to unconnected client (%d)", message.messageId());
        }
        return false;
    }

    mAboutToSend(shared_from_this(), &message);

#ifdef RCT_SERIALIZER_VERIFY_PRIMITIVE_SIZE
    const size_t size = String::npos;
#else
    const size_t size = message.encodedSize();
#endif

    if (size == String::npos || message.mFlags & Message::MessageCache) {
        String header, value;
        message.prepare(mVersion, header, value);
        mPendingWrite += header.size() + value.size();
        assert(size == String::npos || size == (header.size() + value.size() - 4));
        return (mSocketClient->write(header) && (value.isEmpty() || mSocketClient->write(value)));
    } else {
        mPendingWrite += (size + Message::HeaderExtra) + sizeof(int);
        Serializer serializer(std::unique_ptr<SocketClientBuffer>(new SocketClientBuffer(mSocketClient)));
        message.encodeHeader(serializer, size, mVersion);
        message.encode(serializer);
        return !serializer.hasError();
    }
}